

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::ConvertArgOpndIfGeneratorFunction
          (Lowerer *this,Instr *instrArgIn,RegOpnd *generatorArgsPtrOpnd)

{
  StackSym *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  byte bVar4;
  ArgSlot AVar5;
  JITTimeFunctionBody *this_01;
  Opnd *this_02;
  undefined4 *puVar6;
  IndirOpnd *this_03;
  
  this_01 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar2) {
    this_02 = IR::Instr::UnlinkSrc1(instrArgIn);
    OVar3 = IR::Opnd::GetKind(this_02);
    if (OVar3 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar2) goto LAB_005d8221;
      *puVar6 = 0;
    }
    this_00 = (StackSym *)this_02[1]._vptr_Opnd;
    if ((this_00->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_005d8221;
      *puVar6 = 0;
    }
    AVar5 = StackSym::GetParamSlotNum(this_00);
    this_03 = IR::IndirOpnd::New(generatorArgsPtrOpnd,(uint)AVar5 * 8 + -8,TyUint64,this->m_func,
                                 false);
    IR::Opnd::Free(this_02,this->m_func);
    if (instrArgIn->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar2) goto LAB_005d8221;
      *puVar6 = 0;
    }
    func = instrArgIn->m_func;
    if ((this_03->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar2) {
LAB_005d8221:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    bVar4 = (this_03->super_Opnd).field_0xb;
    if ((bVar4 & 2) != 0) {
      this_03 = (IndirOpnd *)IR::Opnd::Copy(&this_03->super_Opnd,func);
      bVar4 = (this_03->super_Opnd).field_0xb;
    }
    (this_03->super_Opnd).field_0xb = bVar4 | 2;
    instrArgIn->m_src1 = &this_03->super_Opnd;
  }
  return;
}

Assistant:

void
Lowerer::ConvertArgOpndIfGeneratorFunction(IR::Instr *instrArgIn, IR::RegOpnd *generatorArgsPtrOpnd)
{
    if (this->m_func->GetJITFunctionBody()->IsCoroutine())
    {
        // Replace stack param operand with offset into arguments array held by
        // the generator object.
        IR::Opnd * srcOpnd = instrArgIn->UnlinkSrc1();
        StackSym * symParam = srcOpnd->AsSymOpnd()->m_sym->AsStackSym();
        Js::ArgSlot argIndex = symParam->GetParamSlotNum();

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(generatorArgsPtrOpnd, (argIndex - 1) * MachPtr, TyMachPtr, this->m_func);

        srcOpnd->Free(this->m_func);
        instrArgIn->SetSrc1(indirOpnd);
    }
}